

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O3

void __thiscall PatternModel::setCursorRowImpl(PatternModel *this,int row,CursorChangeFlags *flags)

{
  Pattern *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar2 = (this->mCursor).super_PatternCursorBase.row;
  if (iVar2 != row) {
    if (row < 0) {
      iVar4 = 0;
      if (this->mWrapPattern == true) {
        iVar4 = this->mCursorPattern;
        if (iVar4 == 0) {
          iVar4 = patterns(this);
        }
        setCursorPatternImpl(this,iVar4 + -1,flags);
        iVar3 = trackerboy::Pattern::totalRows(&this->mPatternCurr);
        iVar4 = 0;
        if (0 < iVar3 + row) {
          iVar4 = iVar3 + row;
        }
      }
    }
    else {
      this_00 = &this->mPatternCurr;
      iVar3 = trackerboy::Pattern::totalRows(this_00);
      iVar4 = row;
      if (iVar3 <= row) {
        bVar1 = this->mWrapPattern;
        iVar3 = trackerboy::Pattern::totalRows(this_00);
        if (bVar1 == true) {
          iVar6 = this->mCursorPattern + 1;
          iVar5 = patterns(this);
          iVar4 = 0;
          if (iVar6 != iVar5) {
            iVar4 = iVar6;
          }
          setCursorPatternImpl(this,iVar4,flags);
          iVar5 = trackerboy::Pattern::totalRows(this_00);
          iVar4 = iVar5 + -1;
          if (row - iVar3 < iVar5 + -1) {
            iVar4 = row - iVar3;
          }
        }
        else {
          iVar4 = iVar3 + -1;
        }
      }
    }
    if (iVar4 != iVar2) {
      (this->mCursor).super_PatternCursorBase.row = iVar4;
      *(byte *)&flags->i = (byte)flags->i | 1;
    }
  }
  return;
}

Assistant:

void PatternModel::setCursorRowImpl(int row, CursorChangeFlags &flags) {
    if (row == mCursor.row) {
        return;
    }

    int oldRow = mCursor.row;
    int newRow;
    if (row < 0) {
        // go to the previous pattern or wrap around to the last one
        if (mWrapPattern) {
            int prevPattern;
            if (mCursorPattern == 0) {
                prevPattern = patterns() - 1;
            } else {
                prevPattern = mCursorPattern - 1;
            }
            setCursorPatternImpl(prevPattern, flags);
            newRow = std::max(0, (int)mPatternCurr.totalRows() + row);
        } else {
            newRow = 0;
        }
    } else if (row >= (int)mPatternCurr.totalRows()) {
        if (mWrapPattern) {
            // go to the next pattern or wrap around to the first one
            row -= mPatternCurr.totalRows();
            auto nextPattern = mCursorPattern + 1;
            if (nextPattern == patterns()) {
                nextPattern = 0;
            }
            setCursorPatternImpl(nextPattern, flags);
            newRow = std::min((int)mPatternCurr.totalRows() - 1, row);
        } else {
            newRow = mPatternCurr.totalRows() - 1;
        }
    } else {
        newRow = row;
    }

    if (newRow != oldRow) {
        mCursor.row = newRow;
        flags |= CursorRowChanged;
    }
}